

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpUpdate_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tnew)

{
  int iVar1;
  double *pdVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  int iVar5;
  long *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  N_Vector *yhist;
  sunrealtype *thist;
  int nmax;
  int nhist;
  N_Vector ytmp;
  sunrealtype tdiff;
  int i;
  int local_5c;
  double local_58;
  double local_30;
  int local_24;
  
  iVar1 = *(int *)(*in_RSI + 0x18);
  local_5c = *(int *)*in_RSI;
  pdVar2 = *(double **)(*in_RSI + 0x10);
  puVar3 = *(undefined8 **)(*in_RSI + 8);
  *(double *)(*in_RSI + 0x20) =
       *(double *)(in_RDI + 8) * 100.0 *
       (ABS(*(double *)(in_RDI + 0x2f0)) + ABS(*(double *)(in_RDI + 0x2c0)));
  local_30 = ABS(in_XMM0_Qa - *pdVar2);
  for (local_24 = 1; local_24 < iVar1; local_24 = local_24 + 1) {
    if (ABS(in_XMM0_Qa - pdVar2[local_24]) <= local_30) {
      local_58 = ABS(in_XMM0_Qa - pdVar2[local_24]);
    }
    else {
      local_58 = local_30;
    }
    local_30 = local_58;
  }
  if (*(double *)(*in_RSI + 0x20) < local_30) {
    uVar4 = puVar3[local_5c + -1];
    iVar5 = local_5c;
    while (local_24 = iVar5 + -1, 0 < local_24) {
      pdVar2[local_24] = pdVar2[iVar5 + -2];
      puVar3[local_24] = puVar3[iVar5 + -2];
      iVar5 = local_24;
    }
    *puVar3 = uVar4;
    *pdVar2 = in_XMM0_Qa;
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x248),*puVar3);
    if (iVar1 + 1 < local_5c) {
      local_5c = iVar1 + 1;
    }
    *(int *)(*in_RSI + 0x18) = local_5c;
  }
  return 0;
}

Assistant:

int arkInterpUpdate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tnew)
{
  int i;
  sunrealtype tdiff;
  N_Vector ytmp;
  int nhist, nmax;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  nmax  = LINT_NMAX(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* update t roundoff value */
  LINT_TROUND(I) = FUZZ_FACTOR * ark_mem->uround *
                   (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* determine if tnew differs sufficiently from stored values */
  tdiff = SUNRabs(tnew - thist[0]);
  for (i = 1; i < nhist; i++)
  {
    tdiff = SUNMIN(tdiff, SUNRabs(tnew - thist[i]));
  }
  if (tdiff <= LINT_TROUND(I)) { return (ARK_SUCCESS); }

  /* shift (t,y) history arrays by one */
  ytmp = yhist[nmax - 1];
  for (i = nmax - 1; i > 0; i--)
  {
    thist[i] = thist[i - 1];
    yhist[i] = yhist[i - 1];
  }
  yhist[0] = ytmp;

  /* copy tnew and ycur into first entry of history arrays */
  thist[0] = tnew;
  N_VScale(ONE, ark_mem->ycur, yhist[0]);

  /* update 'nhist' (first few steps) */
  LINT_NHIST(I) = nhist = SUNMIN(nhist + 1, nmax);

  /* return with success */
  return (ARK_SUCCESS);
}